

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodePushing.cpp
# Opt level: O0

void __thiscall wasm::LocalAnalyzer::visitLocalGet(LocalAnalyzer *this,LocalGet *curr)

{
  reference pvVar1;
  reference local_28;
  LocalGet *local_18;
  LocalGet *curr_local;
  LocalAnalyzer *this_local;
  
  local_18 = curr;
  curr_local = (LocalGet *)this;
  pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->numSets,(ulong)curr->index);
  if (*pvVar1 == 0) {
    local_28 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (&this->sfa,(ulong)local_18->index);
    std::_Bit_reference::operator=(&local_28,false);
  }
  pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->numGets,(ulong)local_18->index);
  *pvVar1 = *pvVar1 + 1;
  return;
}

Assistant:

void visitLocalGet(LocalGet* curr) {
    if (numSets[curr->index] == 0) {
      sfa[curr->index] = false;
    }
    numGets[curr->index]++;
  }